

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int star_oh(char *z)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  
  iVar1 = isConsonant(z);
  uVar3 = 0;
  if (((iVar1 != 0) && (2 < (byte)(*z + 0x89U))) && (lVar2 = (long)z[1], lVar2 != 0)) {
    if (lVar2 == 0x79) {
      iVar1 = isConsonant(z + 2);
    }
    else {
      iVar1 = 1 - (char)(&DAT_001dee7f)[lVar2];
    }
    uVar3 = 0;
    if (iVar1 != 0) {
      iVar1 = isConsonant(z + 2);
      uVar3 = (uint)(iVar1 != 0);
    }
  }
  return uVar3;
}

Assistant:

static int star_oh(const char *z){
  return
    isConsonant(z) &&
    z[0]!='w' && z[0]!='x' && z[0]!='y' &&
    isVowel(z+1) &&
    isConsonant(z+2);
}